

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPrsBuild.c
# Opt level: O0

int Psr_ManIsMapped(Psr_Ntk_t *pNtk)

{
  int iVar1;
  Mio_Library_t *pLib_00;
  Vec_Int_t *pVVar2;
  char *pName;
  Mio_Gate_t *pMVar3;
  bool bVar4;
  int NtkId;
  Mio_Library_t *pLib;
  int iBox;
  Vec_Int_t *vSigs;
  Psr_Ntk_t *pNtk_local;
  
  pLib_00 = (Mio_Library_t *)Abc_FrameReadLibGen();
  if (pLib_00 == (Mio_Library_t *)0x0) {
    return 0;
  }
  pLib._4_4_ = 0;
  while( true ) {
    iVar1 = Psr_NtkBoxNum(pNtk);
    bVar4 = false;
    if (pLib._4_4_ < iVar1) {
      pVVar2 = Psr_BoxSignals(pNtk,pLib._4_4_);
      bVar4 = pVVar2 != (Vec_Int_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Psr_BoxIsNode(pNtk,pLib._4_4_);
    if (iVar1 == 0) {
      iVar1 = Psr_BoxNtk(pNtk,pLib._4_4_);
      pName = Psr_NtkStr(pNtk,iVar1);
      pMVar3 = Mio_LibraryReadGateByName(pLib_00,pName,(char *)0x0);
      if (pMVar3 != (Mio_Gate_t *)0x0) {
        return 1;
      }
    }
    pLib._4_4_ = pLib._4_4_ + 1;
  }
  return 0;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Psr_ManIsMapped( Psr_Ntk_t * pNtk )
{
    Vec_Int_t * vSigs; int iBox;
    Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    if ( pLib == NULL )
        return 0;
    Psr_NtkForEachBox( pNtk, vSigs, iBox )
        if ( !Psr_BoxIsNode(pNtk, iBox) )
        {
            int NtkId = Psr_BoxNtk( pNtk, iBox );
            if ( Mio_LibraryReadGateByName(pLib, Psr_NtkStr(pNtk, NtkId), NULL) )
                return 1;
        }
    return 0;
}